

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O0

void mcsin(mcscxdef *ctx,mcsseg seg,uchar *ptr,ushort siz)

{
  int iVar1;
  long *facility;
  size_t sVar2;
  ushort in_CX;
  void *in_RDX;
  ushort in_SI;
  undefined8 *in_RDI;
  mcsdsdef *desc;
  undefined6 in_stack_ffffffffffffffe0;
  
  facility = (long *)(*(long *)(in_RDI[5] + (long)((int)(uint)in_SI >> 8) * 8) +
                     (long)(int)(in_SI & 0xff) * 0x18);
  if (*(ushort *)((long)facility + 10) < in_CX) {
    in_CX = *(ushort *)((long)facility + 10);
  }
  iVar1 = fseek((FILE *)*in_RDI,*facility,0);
  if (iVar1 != 0) {
    errsigf((errcxdef *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),(char *)facility,0);
  }
  sVar2 = fread(in_RDX,(ulong)in_CX,1,(FILE *)*in_RDI);
  if (sVar2 != 1) {
    errsigf((errcxdef *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),(char *)facility,0);
  }
  *(ushort *)(facility + 2) = *(ushort *)(facility + 2) & 0xfffe;
  return;
}

Assistant:

void mcsin(mcscxdef *ctx, mcsseg seg, uchar *ptr, ushort siz)
{
    mcsdsdef *desc = mcsdsc(ctx, seg);

    IF_DEBUG(printf("<< mcsin: seg=%u, ptr=%lx, siz=%d, objid=%u >>\n",
                    seg, (unsigned long)ptr, siz, desc->mcsdsobj));

    assert(seg < ctx->mcscxmsg);

    /* can only swap in as much as we wrote */
    if (desc->mcsdsosz < siz) siz = desc->mcsdsosz;

    /* seek to and read the segment */
    if (osfseek(ctx->mcscxfp, desc->mcsdsptr, OSFSK_SET))
        errsig(ctx->mcscxerr, ERR_FSEEK);
    if (osfrb(ctx->mcscxfp, ptr, (size_t)siz))
        errsig(ctx->mcscxerr, ERR_FREAD);
    
    desc->mcsdsflg &= ~MCSDSFINUSE;             /* segment no longer in use */
}